

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
::is_non_zero(Heap_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
              *this,ID_index rowIndex)

{
  pointer ppEVar1;
  pointer ppEVar2;
  Field_element c;
  Element local_2c;
  
  local_2c = 0;
  ppEVar1 = (this->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (this->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1;
      ppEVar2 = ppEVar2 + 1) {
    if ((*ppEVar2)->rowIndex_ == rowIndex) {
      persistence_fields::Zp_field_operators<unsigned_int,_void>::add_inplace
                (this->operators_,&local_2c,((*ppEVar2)->super_Entry_field_element_option).element_)
      ;
    }
  }
  return local_2c != 0;
}

Assistant:

inline bool Heap_column<Master_matrix>::is_non_zero(ID_index rowIndex) const
{
  Field_element c(0);
  for (const Entry* entry : column_) {
    if (entry->get_row_index() == rowIndex) {
      if constexpr (Master_matrix::Option_list::is_z2)
        c = !c;
      else
        operators_->add_inplace(c, entry->get_element());
    }
  }
  return c != Field_operators::get_additive_identity();
}